

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
io_object_impl(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
               *this,io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                     *other)

{
  service_type *psVar1;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RSI;
  implementation_type *in_RDI;
  reactive_socket_service<asio::ip::tcp> *unaff_retaddr;
  any_io_executor *in_stack_ffffffffffffffd8;
  per_descriptor_data *this_00;
  implementation_type *impl;
  
  impl = in_RDI;
  psVar1 = get_service(in_RSI);
  *(service_type **)&in_RDI->super_base_implementation_type = psVar1;
  reactive_socket_service<asio::ip::tcp>::implementation_type::implementation_type
            ((implementation_type *)unaff_retaddr);
  this_00 = &in_RDI[1].super_base_implementation_type.reactor_data_;
  get_executor(in_RSI);
  any_io_executor::any_io_executor((any_io_executor *)this_00,in_stack_ffffffffffffffd8);
  reactive_socket_service<asio::ip::tcp>::move_construct
            (unaff_retaddr,impl,(implementation_type *)in_RSI);
  return;
}

Assistant:

io_object_impl(io_object_impl&& other)
    : service_(&other.get_service()),
      executor_(other.get_executor())
  {
    service_->move_construct(implementation_, other.implementation_);
  }